

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::GetTestModelString_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if (*(size_type *)((long)&(_Var1._M_head_impl)->SpecificGroup + 8) == 0) {
    if ((_Var1._M_head_impl)->TestModel == 2) {
      __s = "Continuous";
      __a = &local_a;
    }
    else if ((_Var1._M_head_impl)->TestModel == 1) {
      __s = "Nightly";
      __a = &local_9;
    }
    else {
      __s = "Experimental";
      __a = &local_b;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(_Var1._M_head_impl)->SpecificGroup);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetTestModelString()
{
  if (!this->Impl->SpecificGroup.empty()) {
    return this->Impl->SpecificGroup;
  }
  switch (this->Impl->TestModel) {
    case cmCTest::NIGHTLY:
      return "Nightly";
    case cmCTest::CONTINUOUS:
      return "Continuous";
  }
  return "Experimental";
}